

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  uint uVar1;
  
  if (ptr <= this->buffer_end_ + 0x10) {
    if (this->next_chunk_ == this->patch_buffer_) {
      uVar1 = BytesAvailable(this,ptr);
    }
    else {
      uVar1 = ((int)this->buffer_end_ - (int)ptr) + this->size_;
    }
    if (0 < (int)uVar1) {
      (*this->zcis_->_vptr_ZeroCopyInputStream[3])(this->zcis_,(ulong)uVar1);
      this->overall_limit_ = this->overall_limit_ + uVar1;
    }
    return;
  }
  BackUp((EpsCopyInputStream *)&stack0xffffffffffffffe0);
}

Assistant:

void BackUp(const char* ptr) {
    ABSL_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == patch_buffer_) {
      count = BytesAvailable(ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }